

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::InsertSyncReset::inject_reset_logic
          (InsertSyncReset *this,SequentialStmtBlock *block,Port *port)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  StatementType SVar2;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Var *pVVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Port *port_00;
  StmtBlock *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_04;
  shared_ptr<kratos::IfStmt> sVar10;
  undefined1 local_a0 [8];
  shared_ptr<kratos::IfStmt> if_;
  undefined1 local_78 [8];
  shared_ptr<kratos::ScopedStmtBlock> body;
  undefined1 local_50 [8];
  shared_ptr<kratos::IfStmt> sync_reset;
  shared_ptr<kratos::IfStmt> sync_reset_1;
  
  psVar3 = (block->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(block->super_StmtBlock).stmts_.
            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 != 0x10) {
    return;
  }
  peVar4 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar4->type_ != If) goto LAB_001f4a0a;
  Stmt::as<kratos::IfStmt>((Stmt *)local_a0);
  pVVar5 = *(Var **)((long)local_a0 + 0xc0);
  this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a0 + 200);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  bVar8 = has_port_type(pVVar5,AsyncReset);
  if ((bVar8) && (bVar8 = has_port_type(pVVar5,Reset), !bVar8)) {
    port_00 = *(Port **)((long)local_a0 + 0xe0);
    this_02 = *(StmtBlock **)((long)local_a0 + 0xf0);
    body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a0 + 0xf8);
    if (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    psVar3 = (this_02->stmts_).
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this_02->stmts_).
              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 == 0x10) {
      peVar4 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      peVar9 = (element_type *)
               (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
      if (peVar9 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &(peVar9->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &(peVar9->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl + 1;
        }
      }
      if (peVar4->type_ != If) {
LAB_001f4922:
        if (peVar9 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar9);
        }
        goto LAB_001f4930;
      }
      Stmt::as<kratos::IfStmt>((Stmt *)local_50);
      pVVar5 = (((shared_ptr<kratos::Var> *)((long)local_50 + 0xc0))->
               super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_03 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_50 + 200))->_M_pi;
      if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_03->_M_use_count = this_03->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_03->_M_use_count = this_03->_M_use_count + 1;
        }
      }
      bVar8 = has_port_type(pVVar5,ClockEnable);
      if ((bVar8) && (this->over_clk_en_ == false)) {
        peVar6 = (((shared_ptr<kratos::ScopedStmtBlock> *)((long)local_50 + 0xe0))->
                 super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        psVar3 = (peVar6->super_StmtBlock).stmts_.
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (psVar3 == (peVar6->super_StmtBlock).stmts_.
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001f4be0:
          (*(((((shared_ptr<kratos::ScopedStmtBlock> *)((long)local_50 + 0xe0))->
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xb])
                    (&sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_78);
          if (sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          create_if_stmt_wrapper
                    ((StmtBlock *)
                     &sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,port_00,SUB81(port,0));
          IfStmt::set_else((IfStmt *)
                           sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi,(shared_ptr<kratos::ScopedStmtBlock> *)local_78);
          (*(((((shared_ptr<kratos::ScopedStmtBlock> *)((long)local_50 + 0xe0))->
              super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
          if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
               sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ;
          if (sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              pvVar1 = &((sync_reset_1.
                          super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
              UNLOCK();
            }
            else {
              pvVar1 = &((sync_reset_1.
                          super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_Stmt).super_IRNode.fn_name_ln;
              *(int *)&(pvVar1->
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start =
                   *(int *)&(pvVar1->
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          IfStmt::add_then_stmt
                    ((IfStmt *)local_50,
                     (shared_ptr<kratos::Stmt> *)
                     &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
          if (sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          if (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
        }
        else {
          peVar4 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var7 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (peVar4->type_ == If) {
LAB_001f4b4d:
              bVar8 = true;
              this_04._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              goto LAB_001f4b5d;
            }
            goto LAB_001f4be0;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
          SVar2 = peVar4->type_;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          if (SVar2 != If) goto LAB_001f4be0;
          this_04._M_pi =
               (((((((shared_ptr<kratos::ScopedStmtBlock> *)((long)local_50 + 0xe0))->
                   super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                 ->super_StmtBlock).stmts_.
                 super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          if (this_04._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
          goto LAB_001f4b4d;
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_04._M_pi)->_M_use_count = (this_04._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_04._M_pi)->_M_use_count = (this_04._M_pi)->_M_use_count + 1;
          }
          bVar8 = false;
LAB_001f4b5d:
          Stmt::as<kratos::IfStmt>((Stmt *)local_78);
          if (!bVar8) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04._M_pi);
          }
          pVVar5 = *(Var **)((long)local_78 + 0xc0);
          p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78 + 200);
          if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar8 = has_port_type(pVVar5,Reset);
          }
          else {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
            bVar8 = has_port_type(pVVar5,Reset);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
          if (bVar8 == false) goto LAB_001f4be0;
        }
        if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
        }
        if (sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      else {
        bVar8 = has_port_type(pVVar5,Reset);
        if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
        }
        if (sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        if (!bVar8) goto LAB_001f4922;
      }
    }
    else {
LAB_001f4930:
      sVar10 = create_if_stmt_wrapper((StmtBlock *)local_50,port_00,SUB81(port,0));
      (*(this_02->super_Stmt).super_IRNode._vptr_IRNode[0xb])
                (&sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_02,
                 sVar10.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_78);
      if (sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   sync_reset_1.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      IfStmt::set_else((IfStmt *)local_50,(shared_ptr<kratos::ScopedStmtBlock> *)local_78);
      (*(this_02->super_Stmt).super_IRNode._vptr_IRNode[0xc])(this_02);
      peVar9 = sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
      if (sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &((sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &((sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->super_Stmt).super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      StmtBlock::add_stmt(this_02,(shared_ptr<kratos::Stmt> *)
                                  &sync_reset.
                                   super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
      if (peVar9 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar9);
      }
      peVar9 = sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        peVar9 = sync_reset.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
    }
    if (peVar9 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar9);
    }
    if (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (body.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_001f4a0a:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void inject_reset_logic(SequentialStmtBlock* block, Port* port) const {
        // only inject when there is a async reset logic
        auto stmts_count = block->size();
        if (stmts_count != 1) return;
        auto stmt = block->get_stmt(0);
        if (stmt->type() != StatementType::If) return;
        auto if_ = stmt->as<IfStmt>();
        auto const& cond = if_->predicate();
        // if it doesn't have async reset logic, or it already has sync reset logic
        // quit
        if (!has_port_type(cond.get(), PortType::AsyncReset) ||
            has_port_type(cond.get(), PortType::Reset))
            return;
        auto* reset_stmt = if_->then_body().get();
        // okay we have reset now. now we need to detect if it has clock enable
        // logic or not
        // we need to detect the clock enable logic and make sure that the ordering is what
        // specified in the
        auto else_body = if_->else_body();
        // detect if clock enable have been in place
        if (else_body->size() == 1) {
            auto then_stmt = else_body->get_stmt(0);
            if (then_stmt->type() == StatementType::If) {
                auto if_then = then_stmt->as<IfStmt>();
                auto target = if_then->predicate();
                if (has_port_type(target.get(), PortType::ClockEnable) && !over_clk_en_) {
                    // could be the case that it already has a reset
                    if (!if_then->then_body()->empty() &&
                        if_then->then_body()->get_stmt(0)->type() == StatementType::If) {
                        auto if_2 = if_then->then_body()->get_stmt(0)->as<IfStmt>();
                        // user already put it there
                        if (has_port_type(if_2->predicate().get(), PortType::Reset)) return;
                    }
                    // insert inside the clock enable body
                    auto body = if_then->then_body()->clone()->as<ScopedStmtBlock>();
                    // need to duplicate the logic in reset
                    auto sync_reset = create_if_stmt_wrapper(reset_stmt, *port, true);
                    sync_reset->set_else(body);
                    if_then->then_body()->clear();
                    if_then->add_then_stmt(sync_reset);
                    return;
                } else if (has_port_type(target.get(), PortType::Reset)) {
                    // already has a sync reset
                    return;
                }
            }
        }
        auto sync_reset = create_if_stmt_wrapper(reset_stmt, *port, true);
        auto body = else_body->clone()->as<ScopedStmtBlock>();
        sync_reset->set_else(body);
        else_body->clear();
        else_body->add_stmt(sync_reset);
    }